

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O2

DeviceAPI * __thiscall
tvm::runtime::DeviceAPIManager::GetAPI(DeviceAPIManager *this,int type,bool allow_missing)

{
  char *__s;
  DeviceAPI *pDVar1;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  if (type < 0x80) {
    pDVar1 = (this->api_)._M_elems[type];
    if (pDVar1 == (DeviceAPI *)0x0) {
      __s = DeviceName(type);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_59);
      pDVar1 = GetAPI(this,&local_38,allow_missing);
      (this->api_)._M_elems[type] = pDVar1;
      std::__cxx11::string::~string((string *)&local_38);
      pDVar1 = (this->api_)._M_elems[type];
    }
  }
  else {
    pDVar1 = this->rpc_api_;
    if (pDVar1 == (DeviceAPI *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"rpc",&local_59);
      pDVar1 = GetAPI(this,&local_58,allow_missing);
      this->rpc_api_ = pDVar1;
      std::__cxx11::string::~string((string *)&local_58);
      pDVar1 = this->rpc_api_;
    }
  }
  return pDVar1;
}

Assistant:

DeviceAPI *GetAPI(int type, bool allow_missing) {
    if (type < kRPCSessMask) {
      if (api_[type] != nullptr)
        return api_[type];
      /* [RISCV-DLR] multi-threading is not supported, so lock is unnecessary */
      //std::lock_guard<std::mutex> lock(mutex_);
      if (api_[type] != nullptr)
        return api_[type];
      api_[type] = GetAPI(DeviceName(type), allow_missing);
      return api_[type];
    } else {
      if (rpc_api_ != nullptr)
        return rpc_api_;
      /* [RISCV-DLR] multi-threading is not supported, so lock is unnecessary */
      //std::lock_guard<std::mutex> lock(mutex_);
      if (rpc_api_ != nullptr)
        return rpc_api_;
      rpc_api_ = GetAPI("rpc", allow_missing);
      return rpc_api_;
    }
  }